

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O3

void duckdb::MakeTimestampFun::GetFunctions(void)

{
  BaseScalarFunction *pBVar1;
  long in_RDI;
  ScalarFunction *func;
  BaseScalarFunction *function;
  long lVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_4b1;
  code *local_4b0;
  undefined8 local_4a8;
  code *local_4a0;
  code *local_498;
  code *local_490;
  undefined8 local_488;
  code *local_480;
  code *local_478;
  LogicalType local_470 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_458;
  LogicalType local_440 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_428;
  LogicalType local_410 [24];
  LogicalType local_3f8 [24];
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  LogicalType local_3c0 [24];
  LogicalType local_3a8 [24];
  LogicalType local_390 [24];
  LogicalType local_378 [24];
  LogicalType local_360 [24];
  LogicalType local_348 [24];
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0 [176];
  
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"make_timestamp","");
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0]);
  }
  duckdb::LogicalType::LogicalType(local_3c0,BIGINT);
  duckdb::LogicalType::LogicalType(local_3a8,BIGINT);
  duckdb::LogicalType::LogicalType(local_390,BIGINT);
  duckdb::LogicalType::LogicalType(local_378,BIGINT);
  duckdb::LogicalType::LogicalType(local_360,BIGINT);
  duckdb::LogicalType::LogicalType(local_348,DOUBLE);
  __l._M_len = 6;
  __l._M_array = local_3c0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_428,__l,&local_4b1);
  duckdb::LogicalType::LogicalType(local_440,TIMESTAMP);
  local_488 = 0;
  local_490 = ExecuteMakeTimestamp<long>;
  local_478 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_480 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_3f8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_208,&local_428,local_440,&local_490,0,0,0,0,local_3f8,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_208);
  local_208._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_208 + 0xb0U),(_Any_data *)((long)&local_208 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_3f8);
  if (local_480 != (code *)0x0) {
    (*local_480)(&local_490,&local_490,3);
  }
  duckdb::LogicalType::~LogicalType(local_440);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_428);
  lVar2 = 0x78;
  do {
    duckdb::LogicalType::~LogicalType(local_3c0 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_3c0,BIGINT);
  __l_00._M_len = 1;
  __l_00._M_array = local_3c0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_458,__l_00,&local_4b1);
  duckdb::LogicalType::LogicalType(local_470,TIMESTAMP);
  local_4a8 = 0;
  local_4b0 = ExecuteMakeTimestamp<long>;
  local_498 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_4a0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_410,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_330,&local_458,local_470,&local_4b0,0,0,0,0,local_410,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_330);
  local_330._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_330 + 0xb0U),(_Any_data *)((long)&local_330 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_410);
  if (local_4a0 != (code *)0x0) {
    (*local_4a0)(&local_4b0,&local_4b0,3);
  }
  duckdb::LogicalType::~LogicalType(local_470);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_458);
  duckdb::LogicalType::~LogicalType(local_3c0);
  function = *(BaseScalarFunction **)(in_RDI + 0x20);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  if (function != pBVar1) {
    do {
      BaseScalarFunction::SetReturnsError(local_e0,function);
      duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      function = function + 0x128;
    } while (function != pBVar1);
  }
  return;
}

Assistant:

ScalarFunctionSet MakeTimestampFun::GetFunctions() {
	ScalarFunctionSet operator_set("make_timestamp");
	operator_set.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT,
	                                         LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::DOUBLE},
	                                        LogicalType::TIMESTAMP, ExecuteMakeTimestamp<int64_t>));
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::BIGINT}, LogicalType::TIMESTAMP, ExecuteMakeTimestamp<int64_t>));

	for (auto &func : operator_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return operator_set;
}